

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

int __thiscall
CVmObjFileName::getp_getFileType(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  vm_datatype_t vVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  CVmNetFile *this_00;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long *in_FS_OFFSET;
  unsigned_long osmode;
  unsigned_long osattr;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  int local_168 [2];
  unsigned_long local_160;
  uint local_158 [2];
  long local_150;
  void *local_148;
  __jmp_buf_tag local_140;
  vm_rcdesc local_78;
  
  if (oargc == (uint *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *oargc;
  }
  if (getp_getFileType(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getFileType();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getFileType::desc);
  if (iVar3 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&local_78,(EVP_PKEY_CTX *)"FileName.getFileType");
    uVar7 = 0xb;
    this_00 = CVmObjFile::get_filename_from_obj
                        (self,&local_78,0x1001,0xb,"application/octet-stream");
    if (uVar6 == 0) {
      uVar4 = 1;
    }
    else {
      vVar1 = sp_[-1].typ;
      uVar7 = (uint)(vVar1 != VM_TRUE);
      if (vVar1 - VM_STACK < 0xfffffffe) {
        err_throw(0x902);
      }
      uVar4 = (uint)(vVar1 != VM_TRUE);
    }
    G_err_frame::__tls_init();
    local_150 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_158;
    local_158[0] = _setjmp(&local_140);
    if (local_158[0] == 0) {
      iVar3 = CVmNetFile::get_file_mode(this_00,(unsigned_long *)local_168,&local_160,uVar4);
      uVar7 = (uint)(iVar3 == 0);
    }
    if (-1 < (short)local_158[0]) {
      local_158[0] = local_158[0] | 0x8000;
      CVmNetFile::abandon(this_00);
    }
    lVar5 = local_150;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar5;
    if ((local_158[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar2 = local_148;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_158[0] & 2) != 0) {
      free(local_148);
    }
    if ((uVar7 & 1) == 0) {
      uVar7 = 0;
      lVar5 = 8;
      do {
        if ((*(ulong *)(&UNK_002c99c8 + lVar5) & (long)local_168[0]) != 0) {
          uVar7 = uVar7 | *(uint *)((long)&filemode_to_filetype(int)::xlat + lVar5);
        }
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x78);
      uVar4 = special_filetype_flags(this);
      retval->typ = VM_INT;
      (retval->val).obj = uVar4 | uVar7;
    }
    else {
      retval->typ = VM_NIL;
    }
    sp_ = sp_ + -(long)(int)uVar6;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_getFileType(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the GETINFO access mode */
    vm_rcdesc rc(vmg_ "FileName.getFileType",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_GETFILETYPE, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_GETINFO,
        OSFTUNK, "application/octet-stream");

    /* check to see if we're following links (follow them by default) */
    int follow_links = TRUE;
    if (argc >= 1)
    {
        /* 
         *   note that our 'asLink' parameter has the opposite sense from
         *   'follow_links', so invert the parameter value 
         */
        follow_links = !G_stk->get(0)->get_logical();
        if (!G_stk->get(0)->is_logical())
            err_throw(VMERR_BAD_VAL_BIF);
    }

    int ok;
    unsigned long osmode, osattr;
    err_try
    {
        /* get the file type from the netfile object */
        ok = netfile->get_file_mode(vmg_ &osmode, &osattr, follow_links);
    }